

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O3

void __thiscall
OpenMD::ForceMatrixDecomposition::buildNeighborList
          (ForceMatrixDecomposition *this,vector<int,_std::allocator<int>_> *neighborList,
          vector<int,_std::allocator<int>_> *point,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *savedPositions
          )

{
  vector<int,std::allocator<int>> *this_00;
  double dVar1;
  undefined8 uVar2;
  int iVar3;
  pointer piVar4;
  pointer pVVar5;
  iterator iVar6;
  pointer pvVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *this_01;
  uint i;
  long lVar15;
  double *pdVar16;
  undefined8 *puVar17;
  pointer pVVar18;
  long lVar19;
  long lVar20;
  Snapshot *pSVar21;
  ulong uVar22;
  int j_4;
  int *__args;
  int iVar23;
  int iVar24;
  int iVar25;
  int j_2;
  pointer pVVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  double tmp;
  double dVar30;
  int iVar32;
  undefined1 auVar31 [16];
  double tmp_4;
  double dVar33;
  double tmp_5;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  Vector<int,_3U> result_1;
  Vector3d scaled;
  Vector3d rs;
  Vector<double,_3U> v_2;
  Vector<double,_3U> v_1;
  Vector<double,_3U> v;
  Vector3d dr;
  Vector3i whichCell;
  Mat3x3d box;
  Mat3x3d invBox;
  uint local_274;
  Snapshot *local_270;
  undefined8 local_268;
  double dStack_260;
  double local_258;
  double local_248 [4];
  double local_228 [3];
  vector<int,_std::allocator<int>_> *local_210;
  double local_208 [4];
  double local_1e8 [4];
  double local_1c8 [4];
  Vector3d local_1a8;
  undefined8 local_188;
  int local_180;
  vector<int,std::allocator<int>> *local_178;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_170;
  double local_168;
  undefined8 uStack_160;
  double local_158 [4];
  double local_138 [3];
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_120;
  Mat3x3d local_118;
  double local_c8 [10];
  undefined8 local_78 [9];
  
  piVar4 = (neighborList->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((neighborList->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    (neighborList->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
  }
  piVar4 = (point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    (point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar4;
  }
  pSVar21 = ((this->super_ForceDecomposition).sman_)->currentSnapshot_;
  local_c8[8] = 0.0;
  local_c8[6] = 0.0;
  local_c8[7] = 0.0;
  local_c8[4] = 0.0;
  local_c8[5] = 0.0;
  local_c8[2] = 0.0;
  local_c8[3] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_78[8] = 0;
  local_78[6] = 0;
  local_78[7] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_228[2] = 0.0;
  local_228[0] = 0.0;
  local_228[1] = 0.0;
  local_248[2] = 0.0;
  local_248[0] = 0.0;
  local_248[1] = 0.0;
  local_1a8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1a8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1a8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_188 = 0;
  local_180 = 0;
  local_170 = &(this->super_ForceDecomposition).cellList_;
  local_178 = (vector<int,std::allocator<int>> *)neighborList;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(local_170,
                    (this->super_ForceDecomposition).cellList_.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::vector<int,_std::allocator<int>_>::resize(point,(long)this->nGroups_ + 1);
  local_270 = pSVar21;
  if ((this->super_ForceDecomposition).usePeriodicBoundaryConditions_ == false) {
    Snapshot::getBoundingBox(&local_118,pSVar21);
    lVar15 = 0;
    do {
      *(undefined8 *)((long)local_c8 + lVar15 + 0x10) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar15 + 0x10);
      uVar2 = *(undefined8 *)
               ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar15 + 8);
      *(undefined8 *)((long)local_c8 + lVar15) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar15);
      *(undefined8 *)((long)local_c8 + lVar15 + 8) = uVar2;
      lVar15 = lVar15 + 0x18;
    } while (lVar15 != 0x48);
    Snapshot::getInvBoundingBox(&local_118,local_270);
    lVar15 = 0;
    do {
      *(undefined8 *)((long)local_78 + lVar15 + 0x10) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar15 + 0x10);
      uVar2 = *(undefined8 *)
               ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar15 + 8);
      *(undefined8 *)((long)local_78 + lVar15) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar15);
      *(undefined8 *)((long)local_78 + lVar15 + 8) = uVar2;
      lVar15 = lVar15 + 0x18;
    } while (lVar15 != 0x48);
  }
  else {
    Snapshot::getHmat(&local_118,pSVar21);
    lVar15 = 0;
    do {
      *(undefined8 *)((long)local_c8 + lVar15 + 0x10) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar15 + 0x10);
      uVar2 = *(undefined8 *)
               ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar15 + 8);
      *(undefined8 *)((long)local_c8 + lVar15) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar15);
      *(undefined8 *)((long)local_c8 + lVar15 + 8) = uVar2;
      lVar15 = lVar15 + 0x18;
    } while (lVar15 != 0x48);
    Snapshot::getInvHmat(&local_118,local_270);
    lVar15 = 0;
    do {
      *(undefined8 *)((long)local_78 + lVar15 + 0x10) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar15 + 0x10);
      uVar2 = *(undefined8 *)
               ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar15 + 8);
      *(undefined8 *)((long)local_78 + lVar15) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar15);
      *(undefined8 *)((long)local_78 + lVar15 + 8) = uVar2;
      lVar15 = lVar15 + 0x18;
    } while (lVar15 != 0x48);
  }
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  local_1c8[2] = 0.0;
  pdVar16 = local_c8;
  lVar15 = 0;
  do {
    local_1c8[lVar15] = *pdVar16;
    dVar1 = local_1c8[2];
    dVar33 = local_1c8[1];
    dVar30 = local_1c8[0];
    lVar15 = lVar15 + 1;
    pdVar16 = pdVar16 + 3;
  } while (lVar15 != 3);
  local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
       local_1c8[2];
  local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       local_1c8[0];
  local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
       local_1c8[1];
  local_1e8[0] = 0.0;
  local_1e8[1] = 0.0;
  local_1e8[2] = 0.0;
  pdVar16 = local_c8 + 1;
  lVar15 = 0;
  do {
    local_1e8[lVar15] = *pdVar16;
    dVar14 = local_1e8[2];
    dVar13 = local_1e8[1];
    dVar12 = local_1e8[0];
    lVar15 = lVar15 + 1;
    pdVar16 = pdVar16 + 3;
  } while (lVar15 != 3);
  local_1c8[2] = local_1e8[2];
  local_1c8[0] = local_1e8[0];
  local_1c8[1] = local_1e8[1];
  local_208[0] = 0.0;
  local_208[1] = 0.0;
  local_208[2] = 0.0;
  pdVar16 = local_c8 + 2;
  lVar15 = 0;
  do {
    local_208[lVar15] = *pdVar16;
    dVar11 = local_208[2];
    dVar10 = local_208[1];
    lVar15 = lVar15 + 1;
    pdVar16 = pdVar16 + 3;
  } while (lVar15 != 3);
  local_1e8[2] = local_208[2];
  local_1e8[0] = local_208[0];
  local_1e8[1] = local_208[1];
  dVar39 = local_208[0] * dVar13;
  dVar34 = dVar13 * local_208[2];
  dVar35 = dVar14 * local_208[0];
  dVar37 = local_208[2] * dVar33;
  dVar38 = local_208[0] * dVar1;
  dVar36 = local_208[0] * dVar33;
  local_208[0] = dVar33 * dVar14 - dVar13 * dVar1;
  local_208[1] = dVar1 * dVar12 - dVar14 * dVar30;
  local_208[2] = dVar30 * dVar13 - dVar12 * dVar33;
  local_138[0] = dVar34 - dVar14 * dVar10;
  local_138[1] = dVar35 - dVar12 * dVar11;
  local_138[2] = dVar12 * dVar10 - dVar39;
  local_158[0] = dVar1 * dVar10 - dVar37;
  local_158[1] = dVar30 * dVar11 - dVar38;
  local_158[2] = dVar36 - dVar30 * dVar10;
  dVar30 = 0.0;
  lVar15 = 0;
  do {
    dVar30 = dVar30 + local_208[lVar15] * local_208[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  if (dVar30 < 0.0) {
    dVar30 = sqrt(dVar30);
  }
  else {
    dVar30 = SQRT(dVar30);
  }
  lVar15 = 0;
  do {
    local_208[lVar15] = local_208[lVar15] / dVar30;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  dVar30 = 0.0;
  lVar15 = 0;
  do {
    dVar30 = dVar30 + local_138[lVar15] * local_138[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  if (dVar30 < 0.0) {
    dVar30 = sqrt(dVar30);
  }
  else {
    dVar30 = SQRT(dVar30);
  }
  lVar15 = 0;
  do {
    local_138[lVar15] = local_138[lVar15] / dVar30;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  dVar30 = 0.0;
  lVar15 = 0;
  do {
    dVar30 = dVar30 + local_158[lVar15] * local_158[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  if (dVar30 < 0.0) {
    dVar30 = sqrt(dVar30);
  }
  else {
    dVar30 = SQRT(dVar30);
  }
  lVar15 = 0;
  do {
    local_158[lVar15] = local_158[lVar15] / dVar30;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  dVar30 = 0.0;
  lVar15 = 0;
  do {
    dVar30 = dVar30 + local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][lVar15] * local_138[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  dVar33 = 0.0;
  lVar15 = 0;
  do {
    dVar33 = dVar33 + local_1c8[lVar15] * local_158[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  auVar31._0_8_ = ABS(dVar30);
  dVar30 = 0.0;
  lVar15 = 0;
  do {
    dVar30 = dVar30 + local_1e8[lVar15] * local_208[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  dVar1 = (this->super_ForceDecomposition).rList_;
  auVar31._8_8_ = ABS(dVar33);
  auVar8._8_8_ = dVar1;
  auVar8._0_8_ = dVar1;
  auVar31 = divpd(auVar31,auVar8);
  iVar29 = (int)auVar31._0_8_;
  iVar32 = (int)auVar31._8_8_;
  *(ulong *)(this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_ =
       CONCAT44(iVar32,iVar29);
  iVar27 = (int)(ABS(dVar30) / dVar1);
  (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[2] = iVar27;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(local_170,(long)(iVar29 * iVar32 * iVar27));
  local_120 = savedPositions;
  if (((iVar27 < 3) || (iVar32 < 3)) || (iVar29 < 3)) {
    iVar27 = this->nGroups_;
    if (0 < iVar27) {
      uVar28 = 0;
      iVar29 = 0;
      pSVar21 = local_270;
      do {
        (point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar28] = iVar29;
        pVVar5 = (pSVar21->cgData).position.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_228[2] = *(double *)((long)pVVar5[uVar28].super_Vector<double,_3U>.data_ + 0x10);
        pVVar5 = pVVar5 + uVar28;
        local_228[0] = (pVVar5->super_Vector<double,_3U>).data_[0];
        local_228[1] = *(double *)((long)(pVVar5->super_Vector<double,_3U>).data_ + 8);
        local_274 = (uint)uVar28;
        iVar27 = this->nGroups_;
        lVar15 = (long)iVar27;
        uVar22 = uVar28 & 0xffffffff;
        if ((long)uVar28 < lVar15) {
          do {
            pVVar5 = (pSVar21->cgData).position.
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_268 = 0.0;
            dStack_260 = 0.0;
            local_258 = 0.0;
            lVar15 = 0;
            do {
              (&local_268)[lVar15] =
                   *(double *)
                    ((long)pVVar5[(int)uVar22].super_Vector<double,_3U>.data_ + lVar15 * 8) -
                   local_228[lVar15];
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
            local_1a8.super_Vector<double,_3U>.data_[2] = local_258;
            local_1a8.super_Vector<double,_3U>.data_[0] = local_268;
            local_1a8.super_Vector<double,_3U>.data_[1] = dStack_260;
            if ((this->super_ForceDecomposition).usePeriodicBoundaryConditions_ == true) {
              Snapshot::wrapVector(local_270,&local_1a8);
              pSVar21 = local_270;
            }
            dVar30 = 0.0;
            lVar15 = 0;
            do {
              dVar33 = local_1a8.super_Vector<double,_3U>.data_[lVar15];
              dVar30 = dVar30 + dVar33 * dVar33;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
            if (dVar30 < (this->super_ForceDecomposition).rListSq_) {
              iVar6._M_current = *(int **)(local_178 + 8);
              if (iVar6._M_current == *(int **)(local_178 + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_178,iVar6,(int *)&local_274);
                pSVar21 = local_270;
              }
              else {
                *iVar6._M_current = local_274;
                *(int **)(local_178 + 8) = iVar6._M_current + 1;
              }
              iVar29 = iVar29 + 1;
            }
            local_274 = local_274 + 1;
            uVar22 = (ulong)local_274;
            iVar27 = this->nGroups_;
          } while ((int)local_274 < iVar27);
          lVar15 = (long)iVar27;
        }
        uVar28 = uVar28 + 1;
      } while ((long)uVar28 < lVar15);
      goto LAB_0023d235;
    }
  }
  else {
    local_274 = 0;
    iVar27 = this->nGroups_;
    if (0 < iVar27) {
      local_210 = point;
      do {
        uVar9 = local_274;
        pVVar5 = (local_270->cgData).position.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_228[2] = *(double *)
                        ((long)pVVar5[(int)local_274].super_Vector<double,_3U>.data_ + 0x10);
        pVVar5 = pVVar5 + (int)local_274;
        local_228[0] = (pVVar5->super_Vector<double,_3U>).data_[0];
        local_228[1] = *(double *)((long)(pVVar5->super_Vector<double,_3U>).data_ + 8);
        local_268 = 0.0;
        dStack_260 = 0.0;
        local_258 = 0.0;
        lVar15 = 0;
        puVar17 = local_78;
        do {
          dVar30 = (double)(&local_268)[lVar15];
          lVar19 = 0;
          do {
            dVar30 = dVar30 + (double)puVar17[lVar19] * local_228[lVar19];
            lVar19 = lVar19 + 1;
          } while (lVar19 != 3);
          (&local_268)[lVar15] = dVar30;
          lVar15 = lVar15 + 1;
          puVar17 = puVar17 + 3;
        } while (lVar15 != 3);
        local_248[2] = local_258;
        local_248[0] = local_268;
        local_248[1] = dStack_260;
        lVar15 = 0;
        do {
          local_168 = local_248[lVar15];
          uStack_160 = 0;
          if (0.0 <= local_168) {
            dVar30 = floor(local_168 + 0.5);
          }
          else {
            dVar30 = ceil(local_168 + -0.5);
          }
          dVar30 = (local_168 - dVar30) + 0.5;
          local_248[lVar15] =
               (double)(~-(ulong)(dVar30 < 1.0) & (ulong)(dVar30 + -1.0) |
                       (ulong)dVar30 & -(ulong)(dVar30 < 1.0));
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        iVar27 = (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[0];
        iVar29 = (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[1];
        this_00 = (vector<int,std::allocator<int>> *)
                  ((this->super_ForceDecomposition).cellList_.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                  (((int)((double)(this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.
                                  data_[2] * local_248[2]) * iVar29 +
                   (int)((double)iVar29 * local_248[1])) * iVar27 +
                  (int)((double)iVar27 * local_248[0])));
        iVar6._M_current = *(int **)(this_00 + 8);
        if (iVar6._M_current == *(int **)(this_00 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_00,iVar6,(int *)&local_274);
        }
        else {
          *iVar6._M_current = uVar9;
          *(int **)(this_00 + 8) = iVar6._M_current + 1;
        }
        local_274 = local_274 + 1;
        iVar27 = this->nGroups_;
      } while ((int)local_274 < iVar27);
      point = local_210;
      if (0 < iVar27) {
        lVar15 = 0;
        iVar29 = 0;
        pSVar21 = local_270;
        do {
          pVVar5 = (pSVar21->cgData).position.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_228[2] = *(double *)((long)pVVar5[lVar15].super_Vector<double,_3U>.data_ + 0x10);
          pVVar5 = pVVar5 + lVar15;
          local_228[0] = (pVVar5->super_Vector<double,_3U>).data_[0];
          local_228[1] = *(double *)((long)(pVVar5->super_Vector<double,_3U>).data_ + 8);
          (local_210->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
          ._M_start[lVar15] = iVar29;
          local_268 = 0.0;
          dStack_260 = 0.0;
          local_258 = 0.0;
          puVar17 = local_78;
          lVar19 = 0;
          do {
            dVar30 = (double)(&local_268)[lVar19];
            lVar20 = 0;
            do {
              dVar30 = dVar30 + (double)puVar17[lVar20] * local_228[lVar20];
              lVar20 = lVar20 + 1;
            } while (lVar20 != 3);
            (&local_268)[lVar19] = dVar30;
            lVar19 = lVar19 + 1;
            puVar17 = puVar17 + 3;
          } while (lVar19 != 3);
          local_248[2] = local_258;
          local_248[0] = local_268;
          local_248[1] = dStack_260;
          lVar19 = 0;
          do {
            local_168 = local_248[lVar19];
            uStack_160 = 0;
            if (0.0 <= local_168) {
              dVar30 = floor(local_168 + 0.5);
            }
            else {
              dVar30 = ceil(local_168 + -0.5);
            }
            dVar30 = (local_168 - dVar30) + 0.5;
            local_248[lVar19] =
                 (double)(~-(ulong)(dVar30 < 1.0) & (ulong)(dVar30 + -1.0) |
                         (ulong)dVar30 & -(ulong)(dVar30 < 1.0));
            lVar19 = lVar19 + 1;
          } while (lVar19 != 3);
          uVar2 = *(undefined8 *)
                   (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_;
          local_188 = CONCAT44((int)((double)(int)((ulong)uVar2 >> 0x20) * local_248[1]),
                               (int)((double)(int)uVar2 * local_248[0]));
          local_180 = (int)((double)(this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.
                                    data_[2] * local_248[2]);
          pVVar18 = (this->super_ForceDecomposition).cellOffsets_.
                    super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pSVar21 = local_270;
          for (pVVar26 = (this->super_ForceDecomposition).cellOffsets_.
                         super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pVVar26 != pVVar18;
              pVVar26 = pVVar26 + 1) {
            dStack_260 = (double)((ulong)dStack_260 & 0xffffffff00000000);
            local_268 = 0.0;
            lVar19 = 0;
            do {
              *(int *)((long)&local_268 + lVar19 * 4) =
                   (pVVar26->super_Vector<int,_3U>).data_[lVar19] +
                   *(int *)((long)&local_188 + lVar19 * 4);
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            iVar27 = (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[0];
            iVar32 = (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[1];
            iVar25 = iVar27 + -1;
            if (-1 < (int)local_268) {
              iVar25 = (int)local_268;
            }
            if (iVar27 <= (int)local_268) {
              iVar25 = 0;
            }
            iVar23 = iVar32 + -1;
            if (-1 < (long)local_268) {
              iVar23 = local_268._4_4_;
            }
            if (iVar32 <= local_268._4_4_) {
              iVar23 = 0;
            }
            iVar3 = (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[2];
            iVar24 = iVar3 + -1;
            if (-1 < dStack_260._0_4_) {
              iVar24 = dStack_260._0_4_;
            }
            if (iVar3 <= dStack_260._0_4_) {
              iVar24 = 0;
            }
            iVar25 = (iVar24 * iVar32 + iVar23) * iVar27 + iVar25;
            pvVar7 = (this->super_ForceDecomposition).cellList_.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            __args = pvVar7[iVar25].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pSVar21 = local_270;
            if (__args != *(pointer *)
                           ((long)&pvVar7[iVar25].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + 8)) {
              do {
                iVar27 = *__args;
                if (lVar15 <= iVar27) {
                  pVVar5 = (pSVar21->cgData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  local_268 = 0.0;
                  dStack_260 = 0.0;
                  local_258 = 0.0;
                  lVar19 = 0;
                  do {
                    (&local_268)[lVar19] =
                         *(double *)
                          ((long)pVVar5[iVar27].super_Vector<double,_3U>.data_ + lVar19 * 8) -
                         local_228[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  local_1a8.super_Vector<double,_3U>.data_[2] = local_258;
                  local_1a8.super_Vector<double,_3U>.data_[0] = local_268;
                  local_1a8.super_Vector<double,_3U>.data_[1] = dStack_260;
                  if ((this->super_ForceDecomposition).usePeriodicBoundaryConditions_ == true) {
                    Snapshot::wrapVector(local_270,&local_1a8);
                    pSVar21 = local_270;
                  }
                  dVar30 = 0.0;
                  lVar19 = 0;
                  do {
                    dVar33 = local_1a8.super_Vector<double,_3U>.data_[lVar19];
                    dVar30 = dVar30 + dVar33 * dVar33;
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  if (dVar30 < (this->super_ForceDecomposition).rListSq_) {
                    iVar6._M_current = *(int **)(local_178 + 8);
                    if (iVar6._M_current == *(int **)(local_178 + 0x10)) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (local_178,iVar6,__args);
                      pSVar21 = local_270;
                    }
                    else {
                      *iVar6._M_current = *__args;
                      *(int **)(local_178 + 8) = iVar6._M_current + 1;
                    }
                    iVar29 = iVar29 + 1;
                  }
                }
                __args = __args + 1;
              } while (__args != *(pointer *)
                                  ((long)&(local_170->
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start[iVar25].
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data + 8));
              pVVar18 = (this->super_ForceDecomposition).cellOffsets_.
                        super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
          }
          lVar15 = lVar15 + 1;
          iVar27 = this->nGroups_;
          point = local_210;
        } while (lVar15 < iVar27);
        goto LAB_0023d235;
      }
    }
  }
  iVar29 = 0;
LAB_0023d235:
  this_01 = local_120;
  (point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [iVar27] = iVar29;
  pVVar5 = (local_120->
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((local_120->
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != pVVar5) {
    (local_120->
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = pVVar5;
  }
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
            (local_120,(long)this->nGroups_);
  pSVar21 = local_270;
  if (0 < this->nGroups_) {
    lVar15 = 0;
    lVar19 = 0;
    do {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                (this_01,(value_type *)
                         ((long)(((pSVar21->cgData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super_Vector<double,_3U>).data_ + lVar15));
      lVar19 = lVar19 + 1;
      lVar15 = lVar15 + 0x18;
    } while (lVar19 < this->nGroups_);
  }
  return;
}

Assistant:

void ForceMatrixDecomposition::buildNeighborList(
      vector<int>& neighborList, vector<int>& point,
      vector<Vector3d>& savedPositions) {
    neighborList.clear();
    point.clear();
    int len = 0;

    bool doAllPairs = false;

    Snapshot* snap_ = sman_->getCurrentSnapshot();
    Mat3x3d box;
    Mat3x3d invBox;

    Vector3d rs, scaled, dr;
    Vector3i whichCell;
    int cellIndex;

#ifdef IS_MPI
    cellListRow_.clear();
    cellListCol_.clear();
    point.resize(nGroupsInRow_ + 1);
#else
    cellList_.clear();
    point.resize(nGroups_ + 1);
#endif

    if (!usePeriodicBoundaryConditions_) {
      box    = snap_->getBoundingBox();
      invBox = snap_->getInvBoundingBox();
    } else {
      box    = snap_->getHmat();
      invBox = snap_->getInvHmat();
    }

    Vector3d A = box.getColumn(0);
    Vector3d B = box.getColumn(1);
    Vector3d C = box.getColumn(2);

    // Required for triclinic cells
    Vector3d AxB = cross(A, B);
    Vector3d BxC = cross(B, C);
    Vector3d CxA = cross(C, A);

    // unit vectors perpendicular to the faces of the triclinic cell:
    AxB.normalize();
    BxC.normalize();
    CxA.normalize();

    // A set of perpendicular lengths in triclinic cells:
    RealType Wa = abs(dot(A, BxC));
    RealType Wb = abs(dot(B, CxA));
    RealType Wc = abs(dot(C, AxB));

    nCells_.x() = int(Wa / rList_);
    nCells_.y() = int(Wb / rList_);
    nCells_.z() = int(Wc / rList_);

    // handle small boxes where the cell offsets can end up repeating cells
    if (nCells_.x() < 3) doAllPairs = true;
    if (nCells_.y() < 3) doAllPairs = true;
    if (nCells_.z() < 3) doAllPairs = true;

    int nCtot = nCells_.x() * nCells_.y() * nCells_.z();

#ifdef IS_MPI
    cellListRow_.resize(nCtot);
    cellListCol_.resize(nCtot);
#else
    cellList_.resize(nCtot);
#endif

    if (!doAllPairs) {
#ifdef IS_MPI

      for (int i = 0; i < nGroupsInRow_; i++) {
        rs = cgRowData.position[i];

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        // find single index of this cell:
        cellIndex = Vlinear(whichCell, nCells_);

        // add this cutoff group to the list of groups in this cell;
        cellListRow_[cellIndex].push_back(i);
      }
      for (int i = 0; i < nGroupsInCol_; i++) {
        rs = cgColData.position[i];

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        // find single index of this cell:
        cellIndex = Vlinear(whichCell, nCells_);

        // add this cutoff group to the list of groups in this cell;
        cellListCol_[cellIndex].push_back(i);
      }

#else
      for (int i = 0; i < nGroups_; i++) {
        rs = snap_->cgData.position[i];

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        // find single index of this cell:
        cellIndex = Vlinear(whichCell, nCells_);

        // add this cutoff group to the list of groups in this cell;
        cellList_[cellIndex].push_back(i);
      }

#endif

#ifdef IS_MPI
      for (int j1 = 0; j1 < nGroupsInRow_; j1++) {
        rs = cgRowData.position[j1];
#else

      for (int j1 = 0; j1 < nGroups_; j1++) {
        rs = snap_->cgData.position[j1];
#endif
        point[j1] = len;

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        for (vector<Vector3i>::iterator os = cellOffsets_.begin();
             os != cellOffsets_.end(); ++os) {
          Vector3i m2v = whichCell + (*os);

          if (m2v.x() >= nCells_.x()) {
            m2v.x() = 0;
          } else if (m2v.x() < 0) {
            m2v.x() = nCells_.x() - 1;
          }

          if (m2v.y() >= nCells_.y()) {
            m2v.y() = 0;
          } else if (m2v.y() < 0) {
            m2v.y() = nCells_.y() - 1;
          }

          if (m2v.z() >= nCells_.z()) {
            m2v.z() = 0;
          } else if (m2v.z() < 0) {
            m2v.z() = nCells_.z() - 1;
          }
          int m2 = Vlinear(m2v, nCells_);
#ifdef IS_MPI
          for (vector<int>::iterator j2 = cellListCol_[m2].begin();
               j2 != cellListCol_[m2].end(); ++j2) {
            // In parallel, we need to visit *all* pairs of row
            // & column indicies and will divide labor in the
            // force evaluation later.
            dr = cgColData.position[(*j2)] - rs;
            if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
            if (dr.lengthSquare() < rListSq_) {
              neighborList.push_back((*j2));
              ++len;
            }
          }
#else
          for (vector<int>::iterator j2 = cellList_[m2].begin();
               j2 != cellList_[m2].end(); ++j2) {
            // Always do this if we're in different cells or if
            // we're in the same cell and the global index of
            // the j2 cutoff group is greater than or equal to
            // the j1 cutoff group.  Note that Rappaport's code
            // has a "less than" conditional here, but that
            // deals with atom-by-atom computation.  OpenMD
            // allows atoms within a single cutoff group to
            // interact with each other.

            if ((*j2) >= j1) {
              dr = snap_->cgData.position[(*j2)] - rs;
              if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
              if (dr.lengthSquare() < rListSq_) {
                neighborList.push_back((*j2));
                ++len;
              }
            }
          }
#endif
        }
      }
    } else {
      // branch to do all cutoff group pairs
#ifdef IS_MPI
      for (int j1 = 0; j1 < nGroupsInRow_; j1++) {
        point[j1] = len;
        rs        = cgRowData.position[j1];
        for (int j2 = 0; j2 < nGroupsInCol_; j2++) {
          dr = cgColData.position[j2] - rs;
          if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
          if (dr.lengthSquare() < rListSq_) {
            neighborList.push_back(j2);
            ++len;
          }
        }
      }
#else
      // include all groups here.
      for (int j1 = 0; j1 < nGroups_; j1++) {
        point[j1] = len;
        rs        = snap_->cgData.position[j1];
        // include self group interactions j2 == j1
        for (int j2 = j1; j2 < nGroups_; j2++) {
          dr = snap_->cgData.position[j2] - rs;
          if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
          if (dr.lengthSquare() < rListSq_) {
            neighborList.push_back(j2);
            ++len;
          }
        }
      }
#endif
    }

#ifdef IS_MPI
    point[nGroupsInRow_] = len;
#else
    point[nGroups_] = len;
#endif

    // save the local cutoff group positions for the check that is
    // done on each loop:
    savedPositions.clear();
    savedPositions.reserve(nGroups_);
    for (int i = 0; i < nGroups_; i++)
      savedPositions.push_back(snap_->cgData.position[i]);
  }